

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_> *
__thiscall
protozero::ScatteredHeapBuffer::GetRanges
          (vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
           *__return_storage_ptr__,ScatteredHeapBuffer *this)

{
  pointer *ppCVar1;
  pointer pSVar2;
  iterator __position;
  Slice *slice;
  pointer pSVar3;
  ContiguousMemoryRange local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar3 = (this->slices_).
           super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->slices_).
           super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar3 != pSVar2) {
    pSVar2[-1].unused_bytes_ =
         (long)(this->writer_->cur_range_).end - (long)this->writer_->write_ptr_;
    do {
      local_30.begin =
           (pSVar3->buffer_)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      local_30.end = local_30.begin + (pSVar3->size_ - pSVar3->unused_bytes_);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        perfetto::std::
        vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
        ::_M_realloc_insert<protozero::ContiguousMemoryRange>
                  (__return_storage_ptr__,__position,&local_30);
      }
      else {
        (__position._M_current)->begin = local_30.begin;
        (__position._M_current)->end = local_30.end;
        ppCVar1 = &(__return_storage_ptr__->
                   super__Vector_base<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<protozero::ContiguousMemoryRange> ScatteredHeapBuffer::GetRanges() {
  std::vector<protozero::ContiguousMemoryRange> ranges;
  for (const auto& slice : GetSlices())
    ranges.push_back(slice.GetUsedRange());
  return ranges;
}